

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

int64_t secp256k1_modinv64_divsteps_59
                  (int64_t zeta,uint64_t f0,uint64_t g0,secp256k1_modinv64_trans2x2 *t)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  int i;
  uint64_t z;
  uint64_t y;
  uint64_t x;
  uint64_t g;
  uint64_t f;
  uint64_t mask2;
  uint64_t mask1;
  uint64_t c2;
  uint64_t c1;
  uint64_t r;
  uint64_t q;
  uint64_t v;
  uint64_t u;
  uint in_stack_ffffffffffffff70;
  uint uVar4;
  uint n;
  secp256k1_modinv64_trans2x2 *in_stack_ffffffffffffff78;
  ulong local_70;
  ulong local_68;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ulong local_8;
  
  local_28 = 8;
  local_30 = 0;
  local_38 = 0;
  local_40 = 8;
  n = 3;
  local_70 = in_RDX;
  local_68 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    if (0x3d < (int)n) {
      *in_RCX = local_28;
      in_RCX[1] = local_30;
      in_RCX[2] = local_38;
      in_RCX[3] = local_40;
      iVar1 = secp256k1_modinv64_det_check_pow2
                        (in_stack_ffffffffffffff78,n,in_stack_ffffffffffffff70);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
                ,0xe0,"test condition failed: secp256k1_modinv64_det_check_pow2(t, 65, 0)");
        abort();
      }
      return local_8;
    }
    if ((local_68 & 1) != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
              ,0xb5,"test condition failed: (f & 1) == 1");
      abort();
    }
    if (local_28 * in_RSI + local_30 * in_RDX != local_68 << ((byte)n & 0x3f)) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
              ,0xb6,"test condition failed: (u * f0 + v * g0) == f << i");
      abort();
    }
    if (local_38 * in_RSI + local_40 * in_RDX != local_70 << ((byte)n & 0x3f)) break;
    uVar2 = (long)local_8 >> 0x3f;
    uVar3 = -(local_70 & 1);
    in_stack_ffffffffffffff78 = (secp256k1_modinv64_trans2x2 *)((local_30 ^ uVar2) - uVar2);
    local_70 = ((local_68 ^ uVar2) - uVar2 & uVar3) + local_70;
    local_38 = ((local_28 ^ uVar2) - uVar2 & uVar3) + local_38;
    local_40 = ((ulong)in_stack_ffffffffffffff78 & uVar3) + local_40;
    uVar3 = uVar3 & uVar2;
    local_8 = (local_8 ^ uVar3) - 1;
    local_68 = (local_70 & uVar3) + local_68;
    local_70 = local_70 >> 1;
    local_28 = ((local_38 & uVar3) + local_28) * 2;
    local_30 = ((local_40 & uVar3) + local_30) * 2;
    uVar4 = in_stack_ffffffffffffff70 & 0xffffff;
    if (-0x250 < (long)local_8) {
      uVar4 = CONCAT13((long)local_8 < 0x250,(int3)in_stack_ffffffffffffff70);
    }
    if ((((byte)(uVar4 >> 0x18) ^ 0xff) & 1) != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
              ,0xd2,"test condition failed: zeta >= -591 && zeta <= 591");
      abort();
    }
    n = n + 1;
    in_stack_ffffffffffffff70 = uVar4;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
          ,0xb7,"test condition failed: (q * f0 + r * g0) == g << i");
  abort();
}

Assistant:

static int64_t secp256k1_modinv64_divsteps_59(int64_t zeta, uint64_t f0, uint64_t g0, secp256k1_modinv64_trans2x2 *t) {
    /* u,v,q,r are the elements of the transformation matrix being built up,
     * starting with the identity matrix times 8 (because the caller expects
     * a result scaled by 2^62). Semantically they are signed integers
     * in range [-2^62,2^62], but here represented as unsigned mod 2^64. This
     * permits left shifting (which is UB for negative numbers). The range
     * being inside [-2^63,2^63) means that casting to signed works correctly.
     */
    uint64_t u = 8, v = 0, q = 0, r = 8;
    volatile uint64_t c1, c2;
    uint64_t mask1, mask2, f = f0, g = g0, x, y, z;
    int i;

    for (i = 3; i < 62; ++i) {
        VERIFY_CHECK((f & 1) == 1); /* f must always be odd */
        VERIFY_CHECK((u * f0 + v * g0) == f << i);
        VERIFY_CHECK((q * f0 + r * g0) == g << i);
        /* Compute conditional masks for (zeta < 0) and for (g & 1). */
        c1 = zeta >> 63;
        mask1 = c1;
        c2 = g & 1;
        mask2 = -c2;
        /* Compute x,y,z, conditionally negated versions of f,u,v. */
        x = (f ^ mask1) - mask1;
        y = (u ^ mask1) - mask1;
        z = (v ^ mask1) - mask1;
        /* Conditionally add x,y,z to g,q,r. */
        g += x & mask2;
        q += y & mask2;
        r += z & mask2;
        /* In what follows, c1 is a condition mask for (zeta < 0) and (g & 1). */
        mask1 &= mask2;
        /* Conditionally change zeta into -zeta-2 or zeta-1. */
        zeta = (zeta ^ mask1) - 1;
        /* Conditionally add g,q,r to f,u,v. */
        f += g & mask1;
        u += q & mask1;
        v += r & mask1;
        /* Shifts */
        g >>= 1;
        u <<= 1;
        v <<= 1;
        /* Bounds on zeta that follow from the bounds on iteration count (max 10*59 divsteps). */
        VERIFY_CHECK(zeta >= -591 && zeta <= 591);
    }
    /* Return data in t and return value. */
    t->u = (int64_t)u;
    t->v = (int64_t)v;
    t->q = (int64_t)q;
    t->r = (int64_t)r;

    /* The determinant of t must be a power of two. This guarantees that multiplication with t
     * does not change the gcd of f and g, apart from adding a power-of-2 factor to it (which
     * will be divided out again). As each divstep's individual matrix has determinant 2, the
     * aggregate of 59 of them will have determinant 2^59. Multiplying with the initial
     * 8*identity (which has determinant 2^6) means the overall outputs has determinant
     * 2^65. */
    VERIFY_CHECK(secp256k1_modinv64_det_check_pow2(t, 65, 0));

    return zeta;
}